

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handlemgr.cpp
# Opt level: O3

PAL_ERROR __thiscall
CorUnix::CSimpleHandleManager::AllocateHandle
          (CSimpleHandleManager *this,CPalThread *pThread,IPalObject *pObject,DWORD dwAccessRights,
          bool fInheritable,HANDLE *ph)

{
  IPalObject *pIVar1;
  uint uVar2;
  ulong uVar3;
  HANDLE_TABLE_ENTRY *pHVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  PAL_ERROR PVar8;
  
  InternalEnterCriticalSection(pThread,&this->m_csLock);
  uVar3 = this->m_hiFreeListStart;
  if (uVar3 == 0xffffffffffffffff) {
    if (PAL_InitializeChakraCoreCalled == false) {
LAB_00330ba2:
      abort();
    }
    uVar2 = this->m_dwTableGrowthRate + this->m_dwTableSize;
    PVar8 = 0xe;
    if (0x3ffffffd < uVar2) goto LAB_00330b85;
    pHVar4 = (HANDLE_TABLE_ENTRY *)InternalRealloc(this->m_rghteHandleTable,(ulong)uVar2 << 4);
    if (pHVar4 == (HANDLE_TABLE_ENTRY *)0x0) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_00330ba2;
      goto LAB_00330b85;
    }
    this->m_rghteHandleTable = pHVar4;
    uVar2 = this->m_dwTableSize;
    uVar3 = (ulong)uVar2;
    uVar5 = this->m_dwTableGrowthRate + uVar2;
    if (uVar2 < uVar5) {
      lVar6 = uVar3 << 4;
      uVar7 = uVar3;
      do {
        uVar7 = uVar7 + 1;
        *(ulong *)((long)&pHVar4->u + lVar6) = uVar7;
        pHVar4 = this->m_rghteHandleTable;
        (&pHVar4->fEntryAllocated)[lVar6] = false;
        uVar3 = (ulong)this->m_dwTableSize;
        uVar5 = this->m_dwTableGrowthRate + this->m_dwTableSize;
        lVar6 = lVar6 + 0x10;
      } while (uVar7 < uVar5);
    }
    this->m_hiFreeListStart = uVar3;
    this->m_dwTableSize = uVar5;
    pHVar4[uVar5 - 1].u.hiNextIndex = 0xffffffffffffffff;
    uVar3 = (ulong)(uint)this->m_hiFreeListStart;
    this->m_hiFreeListEnd = (ulong)(this->m_dwTableSize - 1);
  }
  uVar3 = uVar3 & 0xffffffff;
  pIVar1 = this->m_rghteHandleTable[uVar3].u.pObject;
  this->m_hiFreeListStart = (HANDLE_INDEX)pIVar1;
  if (pIVar1 == (IPalObject *)0xffffffffffffffff) {
    this->m_hiFreeListEnd = 0xffffffffffffffff;
  }
  *ph = (HANDLE)(uVar3 * 4 + 4);
  (*pObject->_vptr_IPalObject[7])(pObject);
  this->m_rghteHandleTable[uVar3].u.pObject = pObject;
  pHVar4 = this->m_rghteHandleTable;
  pHVar4[uVar3].dwAccessRights = dwAccessRights;
  pHVar4[uVar3].fInheritable = fInheritable;
  pHVar4[uVar3].fEntryAllocated = true;
  PVar8 = 0;
LAB_00330b85:
  InternalLeaveCriticalSection(pThread,&this->m_csLock);
  return PVar8;
}

Assistant:

PAL_ERROR
CSimpleHandleManager::AllocateHandle(
    CPalThread *pThread,
    IPalObject *pObject,
    DWORD dwAccessRights,
    bool fInheritable,
    HANDLE *ph
    )
{
    PAL_ERROR palError = NO_ERROR;
    DWORD dwIndex;

    Lock(pThread);

    /* if no free handles are available, we need to grow the handle table and
       add new handles to the pool */
    if (m_hiFreeListStart == c_hiInvalid)
    {
        HANDLE_TABLE_ENTRY* rghteTempTable;

        TRACE("Handle pool empty (%d handles allocated), growing handle table "
              "by %d entries.\n", m_dwTableSize, m_dwTableGrowthRate );

        /* make sure handle values don't overflow */
        if (m_dwTableSize + m_dwTableGrowthRate >= c_MaxIndex)
        {
            WARN("Unable to allocate handle : maximum (%d) reached!\n",
                 m_dwTableSize);
            palError = ERROR_OUTOFMEMORY;
            goto AllocateHandleExit;
        }

        /* grow handle table */
        rghteTempTable = reinterpret_cast<HANDLE_TABLE_ENTRY*>(InternalRealloc(
            m_rghteHandleTable,
            (m_dwTableSize + m_dwTableGrowthRate) * sizeof(HANDLE_TABLE_ENTRY)));
        
        if (NULL == rghteTempTable)
        {
            WARN("not enough memory to grow handle table!\n");
            palError = ERROR_OUTOFMEMORY;
            goto AllocateHandleExit;
        }
        m_rghteHandleTable = rghteTempTable;

        /* update handle table and handle pool */
        for (DWORD dw = m_dwTableSize; dw < m_dwTableSize + m_dwTableGrowthRate; dw += 1)
        {
            /* new handles are initially invalid */
            /* the last "old" handle was m_dwTableSize-1, so the new
               handles range from m_dwTableSize to
               m_dwTableSize+m_dwTableGrowthRate-1 */
            m_rghteHandleTable[dw].u.hiNextIndex = dw + 1;
            m_rghteHandleTable[dw].fEntryAllocated = FALSE;
        }

        m_hiFreeListStart = m_dwTableSize;
        m_dwTableSize += m_dwTableGrowthRate;
        m_rghteHandleTable[m_dwTableSize - 1].u.hiNextIndex = (HANDLE_INDEX)-1;
        m_hiFreeListEnd = m_dwTableSize - 1;
        
    }

    /* take the next free handle */
    dwIndex = m_hiFreeListStart;

    /* remove the handle from the pool */
    m_hiFreeListStart = m_rghteHandleTable[dwIndex].u.hiNextIndex;
    
    /* clear the tail record if this is the last handle slot available */
    if(m_hiFreeListStart == c_hiInvalid) 
    {
        m_hiFreeListEnd = c_hiInvalid;
    }

    /* save the data associated with the new handle */
    *ph = HandleIndexToHandle(dwIndex);
    
    pObject->AddReference();
    m_rghteHandleTable[dwIndex].u.pObject = pObject;
    m_rghteHandleTable[dwIndex].dwAccessRights = dwAccessRights;
    m_rghteHandleTable[dwIndex].fInheritable = fInheritable;
    m_rghteHandleTable[dwIndex].fEntryAllocated = TRUE;

AllocateHandleExit:

    Unlock(pThread);

    return palError;    
}